

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim.c
# Opt level: O0

double VP8SSIMFromStatsClipped(VP8DistoStats *stats)

{
  VP8DistoStats *in_RDI;
  double dVar1;
  
  dVar1 = SSIMCalculation(in_RDI,in_RDI->w);
  return dVar1;
}

Assistant:

double VP8SSIMFromStatsClipped(const VP8DistoStats* const stats) {
  return SSIMCalculation(stats, stats->w);
}